

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O1

int gdImageNegate(gdImagePtr src)

{
  uint uVar1;
  uint uVar2;
  int color;
  code *pcVar3;
  uint uVar4;
  int y;
  uint uVar5;
  int x;
  
  if (src != (gdImagePtr)0x0) {
    if (src->trueColor == 0) {
      pcVar3 = gdImageGetPixel;
    }
    else {
      pcVar3 = gdImageGetTrueColorPixel;
    }
    if (0 < src->sy) {
      y = 0;
      do {
        if (0 < src->sx) {
          x = 0;
          do {
            uVar1 = (*pcVar3)(src,x,y);
            if (src->trueColor == 0) {
              uVar2 = src->red[(int)uVar1];
              uVar4 = src->green[(int)uVar1];
              uVar5 = src->blue[(int)uVar1];
              uVar1 = src->alpha[(int)uVar1];
            }
            else {
              uVar2 = uVar1 >> 0x10 & 0xff;
              uVar4 = uVar1 >> 8 & 0xff;
              uVar5 = uVar1 & 0xff;
              uVar1 = uVar1 >> 0x18 & 0x7f;
            }
            color = gdImageColorAllocateAlpha(src,0xff - uVar2,0xff - uVar4,0xff - uVar5,uVar1);
            if (color == -1) {
              color = gdImageColorClosestAlpha(src,0xff - uVar2,0xff - uVar4,0xff - uVar5,uVar1);
            }
            gdImageSetPixel(src,x,y,color);
            x = x + 1;
          } while (x < src->sx);
        }
        y = y + 1;
      } while (y < src->sy);
    }
    return 1;
  }
  return 0;
}

Assistant:

BGD_DECLARE(int) gdImageNegate(gdImagePtr src)
{
	int x, y;
	int r,g,b,a;
	int new_pxl, pxl;
	FuncPtr f;

	if (src==NULL) {
		return 0;
	}

	f = GET_PIXEL_FUNCTION(src);

	for (y=0; y<src->sy; ++y) {
		for (x=0; x<src->sx; ++x) {
			pxl = f (src, x, y);
			r = gdImageRed(src, pxl);
			g = gdImageGreen(src, pxl);
			b = gdImageBlue(src, pxl);
			a = gdImageAlpha(src, pxl);

			new_pxl = gdImageColorAllocateAlpha(src, 255-r, 255-g, 255-b, a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, 255-r, 255-g, 255-b, a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	return 1;
}